

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

void __thiscall
slang::ast::RandCaseStatement::serializeTo(RandCaseStatement *this,ASTSerializer *serializer)

{
  string_view name;
  bool bVar1;
  Expression *__n;
  Statement *__n_00;
  ASTSerializer *in_RSI;
  size_t in_RDI;
  Item *item;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL> *__range2;
  span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL> *in_stack_ffffffffffffff78
  ;
  ASTSerializer *in_stack_ffffffffffffff80;
  ASTSerializer *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffffa0;
  void *local_58;
  int local_50;
  void *local_48;
  __normal_iterator<const_slang::ast::RandCaseStatement::Item_*,_std::span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL>_>
  local_30;
  long local_28;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
             (char *)in_stack_ffffffffffffff88);
  name._M_str = in_stack_ffffffffffffffa0;
  name._M_len = in_RDI;
  ASTSerializer::startArray(in_RSI,name);
  local_28 = in_RDI + 0x20;
  local_30._M_current =
       (Item *)std::span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL>::begin
                         (in_stack_ffffffffffffff78);
  std::span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL>::end
            ((span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL> *)
             in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::RandCaseStatement::Item_*,_std::span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::RandCaseStatement::Item_*,_std::span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<const_slang::ast::RandCaseStatement::Item_*,_std::span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff78);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::RandCaseStatement::Item_*,_std::span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL>_>
    ::operator*(&local_30);
    ASTSerializer::startObject((ASTSerializer *)0xa7865f);
    in_stack_ffffffffffffff80 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
               (char *)in_stack_ffffffffffffff88);
    __n = not_null<const_slang::ast::Expression_*>::operator*
                    ((not_null<const_slang::ast::Expression_*> *)0xa78684);
    ASTSerializer::write(in_stack_ffffffffffffff80,local_50,local_48,(size_t)__n);
    in_stack_ffffffffffffff88 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,(char *)local_10);
    __n_00 = not_null<const_slang::ast::Statement_*>::operator*
                       ((not_null<const_slang::ast::Statement_*> *)0xa786c4);
    ASTSerializer::write
              (in_stack_ffffffffffffff88,(int)in_stack_ffffffffffffffa0,local_58,(size_t)__n_00);
    ASTSerializer::endObject((ASTSerializer *)0xa786e5);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::RandCaseStatement::Item_*,_std::span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL>_>
    ::operator++(&local_30);
  }
  ASTSerializer::endArray((ASTSerializer *)0xa786fe);
  return;
}

Assistant:

void RandCaseStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("items");
    for (auto& item : items) {
        serializer.startObject();
        serializer.write("expr", *item.expr);
        serializer.write("stmt", *item.stmt);
        serializer.endObject();
    }
    serializer.endArray();
}